

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O3

void __thiscall
duckdb::InMemoryLogStorage::WriteLogEntry
          (InMemoryLogStorage *this,timestamp_t timestamp,LogLevel level,string *log_type,
          string *log_message,RegisteredLoggingContext *context)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  idx_t iVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  undefined4 uVar6;
  iterator iVar7;
  pointer pDVar8;
  reference pvVar9;
  char *pcVar10;
  undefined7 in_register_00000011;
  long lVar11;
  string_t sVar12;
  unique_lock<std::mutex> lck;
  allocator local_95;
  undefined4 local_94;
  InMemoryLogStorage *local_90;
  data_ptr_t local_88;
  string *local_80;
  string *local_78;
  RegisteredLoggingContext *local_70;
  int64_t local_68;
  unique_lock<std::mutex> local_60;
  string local_50;
  
  local_60._M_device = &this->lock;
  local_60._M_owns = false;
  local_68 = timestamp.value;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  iVar7 = ::std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->registered_contexts)._M_h,&context->context_id);
  if (iVar7.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
    WriteLoggingContext(this,context);
  }
  this_00 = &this->entry_buffer;
  local_90 = this;
  local_80 = log_message;
  local_78 = log_type;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  iVar1 = pDVar8->count;
  local_70 = context;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,0);
  local_94 = (undefined4)CONCAT71(in_register_00000011,level);
  pdVar2 = pvVar9->data;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,1);
  pdVar3 = pvVar9->data;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,2);
  pdVar4 = pvVar9->data;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,3);
  pdVar5 = pvVar9->data;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,4);
  local_88 = pvVar9->data;
  *(idx_t *)(pdVar2 + iVar1 * 8) = local_70->context_id;
  *(int64_t *)(pdVar3 + iVar1 * 8) = local_68;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,2);
  sVar12 = StringVector::AddString(pvVar9,local_78);
  lVar11 = iVar1 * 0x10;
  *(long *)(pdVar4 + lVar11) = sVar12.value._0_8_;
  *(long *)(pdVar4 + lVar11 + 8) = sVar12.value._8_8_;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  uVar6 = local_94;
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,3);
  pcVar10 = EnumUtil::ToChars<duckdb::LogLevel>((LogLevel)uVar6);
  ::std::__cxx11::string::string((string *)&local_50,pcVar10,&local_95);
  sVar12 = StringVector::AddString(pvVar9,&local_50);
  *(long *)(pdVar5 + lVar11) = sVar12.value._0_8_;
  *(long *)(pdVar5 + lVar11 + 8) = sVar12.value._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,4);
  sVar12 = StringVector::AddString(pvVar9,local_80);
  *(long *)(local_88 + lVar11) = sVar12.value._0_8_;
  *(long *)(local_88 + lVar11 + 8) = sVar12.value._8_8_;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pDVar8->count = iVar1 + 1;
  if (local_90->max_buffer_size <= iVar1 + 1) {
    FlushInternal(local_90);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return;
}

Assistant:

void InMemoryLogStorage::WriteLogEntry(timestamp_t timestamp, LogLevel level, const string &log_type,
                                       const string &log_message, const RegisteredLoggingContext &context) {
	unique_lock<mutex> lck(lock);

	if (registered_contexts.find(context.context_id) == registered_contexts.end()) {
		WriteLoggingContext(context);
	}

	auto size = entry_buffer->size();
	auto context_id_data = FlatVector::GetData<idx_t>(entry_buffer->data[0]);
	auto timestamp_data = FlatVector::GetData<timestamp_t>(entry_buffer->data[1]);
	auto type_data = FlatVector::GetData<string_t>(entry_buffer->data[2]);
	auto level_data = FlatVector::GetData<string_t>(entry_buffer->data[3]);
	auto message_data = FlatVector::GetData<string_t>(entry_buffer->data[4]);

	context_id_data[size] = context.context_id;
	timestamp_data[size] = timestamp;
	type_data[size] = StringVector::AddString(entry_buffer->data[2], log_type);
	level_data[size] = StringVector::AddString(entry_buffer->data[3], EnumUtil::ToString(level));
	message_data[size] = StringVector::AddString(entry_buffer->data[4], log_message);

	entry_buffer->SetCardinality(size + 1);

	if (size + 1 >= max_buffer_size) {
		FlushInternal();
	}
}